

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

void tcmalloc::SlowTLS::RegisterEntry(Result *result,Entry *entry)

{
  Entry *pEVar1;
  Entry *next;
  SpinLockHolder h;
  Entry *entry_local;
  Result *result_local;
  
  entry->thread_id = result->thread_id_;
  entry->prev = result->ht_place_;
  h.lock_ = (SpinLock *)entry;
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&next,&lock_);
  pEVar1 = *result->ht_place_;
  *(Entry **)(h.lock_ + 6) = pEVar1;
  if (pEVar1 != (Entry *)0x0) {
    pEVar1->prev = (Entry **)(h.lock_ + 6);
  }
  *result->ht_place_ = (Entry *)h.lock_;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&next);
  return;
}

Assistant:

static void RegisterEntry(Result* result, Entry* entry) {
    entry->thread_id = result->thread_id_;
    entry->prev = result->ht_place_;

    SpinLockHolder h(&lock_);

    Entry* next = entry->next = *result->ht_place_;
    if (next) {
      ASSERT(next->prev == result->ht_place_);
      next->prev = &entry->next;
    }
    *result->ht_place_ = entry;
  }